

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# singleton.h
# Opt level: O2

void mwheel::
     Singleton<mwheel::PrototypeFactory<mwheel::test::ClientInterface,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mwheel::test::ClientInterface>_>_>
     ::check_creator(void)

{
  creator_type *pcVar1;
  ostream *poVar2;
  creator_not_set *this;
  string local_1c0;
  stringstream estream;
  ostream local_190 [376];
  
  pcVar1 = get_creator();
  if ((pcVar1->super__Function_base)._M_manager != (_Manager_type)0x0) {
    return;
  }
  std::__cxx11::stringstream::stringstream((stringstream *)&estream);
  poVar2 = std::operator<<(local_190,"ERROR : in Singleton ");
  poVar2 = std::operator<<(poVar2,
                           "N6mwheel9SingletonINS_16PrototypeFactoryINS_4test15ClientInterfaceENSt7__cxx1112basic_stringIcSt11char_traitsIcESaIcEEESt10shared_ptrIS3_EEEEE"
                          );
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<(local_190,"\tcreator not set");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<(local_190,
                           "\tMaybe you forgot to call \"set_creator\" before retrieving the singleton instance?"
                          );
  std::endl<char,std::char_traits<char>>(poVar2);
  this = (creator_not_set *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  creator_not_set::creator_not_set(this,&local_1c0);
  __cxa_throw(this,&Singleton<mwheel::PrototypeFactory<mwheel::test::ClientInterface,std::__cxx11::string,std::shared_ptr<mwheel::test::ClientInterface>>>
                    ::creator_not_set::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

static void check_creator() {
    auto &creator = get_creator();
    if (!creator) {
      // Using auto with an std::stringstream is a PITA!
      std::stringstream estream;
      estream << "ERROR : in Singleton " << typeid(Singleton).name() << std::endl;
      estream << "\tcreator not set" << std::endl;
      estream
          << "\tMaybe you forgot to call \"set_creator\" before retrieving the singleton instance?"
          << std::endl;
      throw creator_not_set(estream.str());
    }
  }